

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_bit_vector.h
# Opt level: O3

dynamic_bit_vector * __thiscall
bsim::xorr(dynamic_bit_vector *__return_storage_ptr__,bsim *this,dynamic_bit_vector *a)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [14];
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  unkuint9 Var14;
  undefined1 auVar15 [11];
  undefined1 auVar16 [14];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  uint6 uVar19;
  dynamic_bit_vector *extraout_RAX;
  dynamic_bit_vector *extraout_RAX_00;
  dynamic_bit_vector *pdVar20;
  dynamic_bit_vector *extraout_RAX_01;
  ulong uVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [13];
  ushort uVar30;
  undefined1 in_XMM9 [16];
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  long lVar36;
  undefined1 auVar37 [16];
  undefined1 in_XMM13 [16];
  string local_30;
  uint uVar38;
  uint uVar39;
  
  iVar22 = (int)a;
  if (0 < iVar22) {
    iVar23 = iVar22 + -1;
    auVar25._4_4_ = iVar23;
    auVar25._0_4_ = iVar23;
    auVar25._8_4_ = iVar23;
    auVar25._12_4_ = iVar23;
    uVar21 = 0;
    auVar25 = auVar25 ^ _DAT_00191780;
    auVar28 = _DAT_00191770;
    auVar26 = (undefined1  [16])0x0;
    do {
      auVar32 = auVar26;
      auVar29 = in_XMM9._0_13_;
      auVar26 = auVar28 ^ _DAT_00191780;
      auVar27._0_4_ = -(uint)(auVar25._0_4_ < auVar26._0_4_);
      auVar27._4_4_ = -(uint)(auVar25._4_4_ < auVar26._4_4_);
      auVar27._8_4_ = -(uint)(auVar25._8_4_ < auVar26._8_4_);
      auVar27._12_4_ = -(uint)(auVar25._12_4_ < auVar26._12_4_);
      if ((~auVar27._0_4_ & 1) != 0) {
        auVar29 = ZEXT113((byte)this[uVar21 >> 3]);
      }
      auVar33._8_4_ = 0xffffffff;
      auVar33._0_8_ = 0xffffffffffffffff;
      auVar33._12_4_ = 0xffffffff;
      auVar33 = auVar27 ^ auVar33;
      if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        uVar24 = auVar29._0_4_;
        auVar29 = ZEXT413(uVar24 & 0xff000000 |
                          uVar24 & 0xff0000 | uVar24 & 0xff | (uint)(byte)this[uVar21 >> 3] << 8);
      }
      if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        auVar29 = ZEXT413(auVar29._0_4_ & 0xff000000 |
                          auVar29._0_4_ & 0xffff | (uint)(byte)this[uVar21 >> 3] << 0x10);
      }
      if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        auVar29 = ZEXT413(auVar29._0_4_ & 0xffffff | (uint)(byte)this[uVar21 >> 3] << 0x18);
      }
      auVar1[0xd] = 0;
      auVar1._0_13_ = auVar29;
      auVar1[0xe] = auVar29[7];
      auVar3[0xc] = auVar29[6];
      auVar3._0_12_ = auVar29._0_12_;
      auVar3._13_2_ = auVar1._13_2_;
      auVar5[0xb] = 0;
      auVar5._0_11_ = auVar29._0_11_;
      auVar5._12_3_ = auVar3._12_3_;
      auVar6[10] = auVar29[5];
      auVar6._0_10_ = auVar29._0_10_;
      auVar6._11_4_ = auVar5._11_4_;
      auVar9[9] = 0;
      auVar9._0_9_ = auVar29._0_9_;
      auVar9._10_5_ = auVar6._10_5_;
      auVar10[8] = auVar29[4];
      auVar10._0_8_ = auVar29._0_8_;
      auVar10._9_6_ = auVar9._9_6_;
      auVar13._7_8_ = 0;
      auVar13._0_7_ = auVar10._8_7_;
      Var14 = CONCAT81(SUB158(auVar13 << 0x40,7),auVar29[3]);
      auVar17._9_6_ = 0;
      auVar17._0_9_ = Var14;
      auVar15._1_10_ = SUB1510(auVar17 << 0x30,5);
      auVar15[0] = auVar29[2];
      auVar18._11_4_ = 0;
      auVar18._0_11_ = auVar15;
      auVar11[2] = auVar29[1];
      auVar11._0_2_ = auVar29._0_2_;
      auVar11._3_12_ = SUB1512(auVar18 << 0x20,3);
      auVar12._2_13_ = auVar11._2_13_;
      auVar12._0_2_ = auVar29._0_2_ & 0xff;
      uVar30 = (ushort)Var14;
      auVar2._10_2_ = 0;
      auVar2._0_10_ = auVar12._0_10_;
      auVar2._12_2_ = uVar30;
      uVar19 = CONCAT42(auVar2._10_4_,auVar15._0_2_);
      auVar16._6_8_ = 0;
      auVar16._0_6_ = uVar19;
      auVar7._4_2_ = auVar11._2_2_;
      auVar7._0_4_ = auVar12._0_4_;
      auVar7._6_8_ = SUB148(auVar16 << 0x40,6);
      uVar24 = auVar12._0_4_ & 0xffff;
      auVar34 = auVar28 & _DAT_00191790;
      auVar26 = pshuflw(auVar33,auVar34,0xfe);
      lVar31 = auVar26._0_8_;
      auVar37._0_4_ = uVar24 >> lVar31;
      uVar38 = auVar7._4_4_;
      auVar37._4_4_ = uVar38 >> lVar31;
      uVar39 = (uint)uVar19;
      auVar37._8_4_ = uVar39 >> lVar31;
      auVar37._12_2_ = uVar30 >> lVar31;
      auVar37._14_2_ = 0;
      auVar33 = pshuflw(in_XMM13,auVar34,0x54);
      auVar35._8_4_ = auVar34._8_4_;
      auVar35._12_4_ = auVar34._12_4_;
      auVar35._0_8_ = auVar34._8_8_;
      auVar26 = pshuflw(auVar37,auVar35,0xfe);
      lVar36 = auVar26._0_8_;
      auVar4._4_4_ = uVar38 >> lVar36;
      auVar4._0_4_ = uVar24 >> lVar36;
      auVar4._8_4_ = uVar39 >> lVar36;
      auVar4._12_2_ = uVar30 >> lVar36;
      in_XMM13._14_2_ = 0;
      in_XMM13._0_14_ = auVar4;
      auVar26 = pshuflw(auVar35,auVar35,0x54);
      lVar31 = auVar26._0_8_;
      auVar8._8_4_ = uVar39 >> lVar31;
      auVar8._0_8_ = (long)CONCAT64(uVar19,uVar38 >> lVar31) << 0x20;
      auVar8._12_2_ = uVar30 >> lVar31;
      in_XMM9._6_2_ = 0;
      in_XMM9._0_6_ = auVar8._8_6_;
      in_XMM9._8_6_ = auVar4._8_6_;
      in_XMM9._14_2_ = 0;
      auVar26._0_4_ = (uVar24 >> auVar33._0_8_) + auVar32._0_4_;
      auVar26._4_4_ = auVar37._4_4_ + auVar32._4_4_;
      auVar26._8_4_ = (uVar39 >> lVar31) + auVar32._8_4_;
      auVar26._12_4_ = (uint)(uVar30 >> lVar36) + auVar32._12_4_;
      uVar24 = (int)uVar21 + 4;
      uVar21 = (ulong)uVar24;
      auVar34._0_4_ = auVar28._0_4_ + 4;
      auVar34._4_4_ = auVar28._4_4_ + 4;
      auVar34._8_4_ = auVar28._8_4_ + 4;
      auVar34._12_4_ = auVar28._12_4_ + 4;
      auVar28 = auVar34;
    } while ((iVar22 + 3U & 0xfffffffc) != uVar24);
    auVar28 = ~auVar27 & auVar26 | auVar32 & auVar27;
    if ((auVar28._12_4_ + auVar28._4_4_ + auVar28._8_4_ + auVar28._0_4_ & 1U) != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"1","");
      dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_30);
      pdVar20 = extraout_RAX_00;
      goto LAB_001743fb;
    }
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"0","");
  dynamic_bit_vector::dynamic_bit_vector(__return_storage_ptr__,1,&local_30);
  pdVar20 = extraout_RAX;
LAB_001743fb:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
    pdVar20 = extraout_RAX_01;
  }
  return pdVar20;
}

Assistant:

static inline dynamic_bit_vector
  xorr(const dynamic_bit_vector& a) {
    int numSet = 0;
    for (int i = 0; i < a.bitLength(); i++) {
      if (a.get(i) == 1) {
	numSet++;
      }
    }

    if ((numSet % 2) == 0) {
      return dynamic_bit_vector(1, "0");
    }

    return dynamic_bit_vector(1, "1");
  }